

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha256.cpp
# Opt level: O1

void __thiscall CHMAC_SHA256::CHMAC_SHA256(CHMAC_SHA256 *this,uchar *key,size_t keylen)

{
  CSHA256 *this_00;
  long lVar1;
  long in_FS_OFFSET;
  uchar rkey [64];
  CSHA256 local_e0;
  uint local_78 [18];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->outer);
  CSHA256::CSHA256(&this->inner);
  if (keylen < 0x41) {
    __memcpy_chk(local_78,key,keylen,0x40);
    __memset_chk((long)local_78 + keylen,0,0x40 - keylen,0x40 - keylen);
  }
  else {
    CSHA256::CSHA256(&local_e0);
    this_00 = CSHA256::Write(&local_e0,key,keylen);
    CSHA256::Finalize(this_00,(uchar *)local_78);
    local_78[8] = 0;
    local_78[9] = 0;
    local_78[10] = 0;
    local_78[0xb] = 0;
    local_78[0xc] = 0;
    local_78[0xd] = 0;
    local_78[0xe] = 0;
    local_78[0xf] = 0;
  }
  lVar1 = 0;
  do {
    *(uint *)((long)local_78 + lVar1) = *(uint *)((long)local_78 + lVar1) ^ 0x5c5c5c5c;
    *(uint *)((long)local_78 + lVar1 + 4) = *(uint *)((long)local_78 + lVar1 + 4) ^ 0x5c5c5c5c;
    *(uint *)((long)local_78 + lVar1 + 8) = *(uint *)((long)local_78 + lVar1 + 8) ^ 0x5c5c5c5c;
    *(uint *)((long)local_78 + lVar1 + 0xc) = *(uint *)((long)local_78 + lVar1 + 0xc) ^ 0x5c5c5c5c;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  CSHA256::Write(&this->outer,(uchar *)local_78,0x40);
  lVar1 = 0;
  do {
    *(uint *)((long)local_78 + lVar1) = *(uint *)((long)local_78 + lVar1) ^ 0x6a6a6a6a;
    *(uint *)((long)local_78 + lVar1 + 4) = *(uint *)((long)local_78 + lVar1 + 4) ^ 0x6a6a6a6a;
    *(uint *)((long)local_78 + lVar1 + 8) = *(uint *)((long)local_78 + lVar1 + 8) ^ 0x6a6a6a6a;
    *(uint *)((long)local_78 + lVar1 + 0xc) = *(uint *)((long)local_78 + lVar1 + 0xc) ^ 0x6a6a6a6a;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  CSHA256::Write(&this->inner,(uchar *)local_78,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA256::CHMAC_SHA256(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[64];
    if (keylen <= 64) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 64 - keylen);
    } else {
        CSHA256().Write(key, keylen).Finalize(rkey);
        memset(rkey + 32, 0, 32);
    }

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 64);

    for (int n = 0; n < 64; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 64);
}